

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkAndJumpListHandler.cpp
# Opt level: O2

void __thiscall ShellLinkAndJumpListHandler::parseFile(ShellLinkAndJumpListHandler *this)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> headerValue;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  
  headerValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  headerValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  headerValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = this->startPosition;
  bVar1 = false;
  do {
    ReadStream::read((ReadStream *)&stack0xffffffffffffffb8,(int)this->rs,(void *)(ulong)uVar2,4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&headerValue,(ReadStream *)&stack0xffffffffffffffb8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &stack0xffffffffffffffb8);
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (headerValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start,
               headerValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,&headerValue);
    uVar2 = Utils::lenFourBytesChar
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
    if (uVar2 == 0x4c) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,&headerValue);
      parseLNKStruct(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
    }
    if (((bVar1 == false) && (uVar2 < 5)) && ((0x1aU >> (uVar2 & 0x1f) & 1) != 0)) {
      bVar1 = parseJumpListStruct(this);
    }
    uVar2 = this->startPosition + 4;
    this->startPosition = uVar2;
  } while (headerValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           headerValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start);
  if (bVar1 == false) {
    poVar3 = std::operator<<((ostream *)&std::cout,"DestList structure not found.");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"This may be because not all LNK structures are found, ");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"or because the DestList is not located after the LNK stream, ")
    ;
    poVar3 = std::operator<<(poVar3,"or because file doesn\'t contain DestList at all.");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"The total number of Shell Link = ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->countOfShellLink);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "The number of Shell Link with errors while parsing = ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->countOfShellLinkWithErrors);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&headerValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void ShellLinkAndJumpListHandler::parseFile() {
    bool isDestListStructFound = false;
    std::vector<unsigned char> headerValue;
    do {
        headerValue =  rs->read(startPosition,4);

        reverse(headerValue.begin(), headerValue.end());
        unsigned int hValue = Utils::lenFourBytesChar(headerValue);

        if(hValue == 0x0000004c) { /* Decode ShellLink Stream = CustDest Jump List */
            ShellLinkAndJumpListHandler::parseLNKStruct(headerValue);
        }
        /* 0x00000004 - Windows 10
         * 0x00000003 - Windows 10
         * 0x00000001 - Windows 7
         * 0x00000001 - Windows 8 */
        if(!isDestListStructFound && (hValue == 0x00000001 || hValue == 0x00000003 || hValue == 0x00000004))
            isDestListStructFound = ShellLinkAndJumpListHandler::parseJumpListStruct();

        startPosition += 4;
    } while(headerValue.size() != 0);

    if(!isDestListStructFound)
        cout << "DestList structure not found." << endl
        << "This may be because not all LNK structures are found, " << endl <<
           "or because the DestList is not located after the LNK stream, " <<
           "or because file doesn't contain DestList at all." << endl << endl << endl;
    cout << "The total number of Shell Link = " << dec << countOfShellLink << endl;
    cout << "The number of Shell Link with errors while parsing = " << dec << countOfShellLinkWithErrors << endl;
}